

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepairCompletePdu.cpp
# Opt level: O1

void __thiscall DIS::RepairCompletePdu::RepairCompletePdu(RepairCompletePdu *this)

{
  LogisticsFamilyPdu::LogisticsFamilyPdu(&this->super_LogisticsFamilyPdu);
  (this->super_LogisticsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__RepairCompletePdu_001a0e60;
  EntityID::EntityID(&this->_receivingEntityID);
  EntityID::EntityID(&this->_repairingEntityID);
  this->_repair = 0;
  this->_padding2 = 0;
  Pdu::setPduType((Pdu *)this,'\t');
  return;
}

Assistant:

RepairCompletePdu::RepairCompletePdu() : LogisticsFamilyPdu(),
   _receivingEntityID(), 
   _repairingEntityID(), 
   _repair(0), 
   _padding2(0)
{
    setPduType( 9 );
}